

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O2

bool __thiscall
xercesc_4_0::XMLReader::getQName(XMLReader *this,XMLBuffer *toFill,int *colonPosition)

{
  bool bVar1;
  XMLSize_t XVar2;
  
  bVar1 = getNCName(this,toFill);
  if (!bVar1) {
    *colonPosition = -1;
    return false;
  }
  XVar2 = this->fCharIndex;
  if (XVar2 == this->fCharsAvail) {
    bVar1 = refreshCharBuffer(this);
    if (!bVar1) goto LAB_002bf5eb;
    XVar2 = this->fCharIndex;
  }
  if (this->fCharBuf[XVar2] == L':') {
    *colonPosition = (int)toFill->fIndex;
    XMLBuffer::append(toFill,L':');
    this->fCharIndex = this->fCharIndex + 1;
    this->fCurCol = this->fCurCol + 1;
    bVar1 = getNCName(this,toFill);
    return bVar1;
  }
LAB_002bf5eb:
  *colonPosition = -1;
  return true;
}

Assistant:

bool XMLReader::getQName(XMLBuffer& toFill, int* colonPosition)
{
    // We are only looking for two iterations (i.e. 'NCNAME':'NCNAME').
    // We will stop when we finished scanning for a QName (i.e. either a second
    // colon or an invalid char).
    if(!getNCName(toFill))
    {
        *colonPosition = -1;
        return false;
    }
    if (fCharIndex == fCharsAvail && !refreshCharBuffer())
    {
        *colonPosition = -1;
        return true;
    }
    if (fCharBuf[fCharIndex] != chColon)
    {
        *colonPosition = -1;
        return true;
    }

    *colonPosition = (int)toFill.getLen();
    toFill.append(chColon);
    fCharIndex++;
    fCurCol++;
    return getNCName(toFill);
}